

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
iterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,Kernel::TypedTermList>
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,TypedTermList query,
          bool retrieveSubstitutions,bool reversed)

{
  TypedTermList as_1;
  undefined8 in_RCX;
  undefined2 uVar1;
  Node *in_RDX;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_RSI;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *in_RDI;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *in_stack_ffffffffffffff50;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this_00;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 local_59;
  
  uVar1 = (undefined2)((ulong)in_RCX >> 0x30);
  this_00 = in_RDI;
  local_59 = isEmpty(in_stack_ffffffffffffff50);
  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
  if (local_59) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
    ::getEmpty();
  }
  else {
    as_1._sort._content._0_4_ = in_stack_ffffffffffffff90;
    as_1.super_TermList._content = (uint64_t)in_RSI;
    as_1._sort._content._4_4_ = in_stack_ffffffffffffff94;
    Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node*,Kernel::TypedTermList,bool,bool>
              ((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)this_00,in_RDI,in_RDX,as_1,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (in_RSI);
    in_stack_ffffffffffffff90 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    Lib::
    pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
              (in_stack_ffffffffffffff98);
  }
  local_59 = !local_59;
  if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) {
    Lib::
    IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
    ::~IterTraits((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                   *)0x3f0207);
  }
  if (local_59) {
    Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
            *)this_00;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }